

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_rt.hpp
# Opt level: O2

type * viennamath::result_of::mult<double,_viennamath::ct_constant<8L>,_false,_true>::instance
                 (type *__return_storage_ptr__,double *lhs,ct_constant<8L> *rhs)

{
  rt_expression_interface<double> *prVar1;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar2;
  rt_expression_interface<double> *prVar3;
  
  prVar1 = traits::clone<viennamath::rt_expression_interface<double>>(*lhs);
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_001336d8;
  prVar3 = traits::clone<viennamath::rt_expression_interface<double>,8l>(rhs);
  (__return_storage_ptr__->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001330d8;
  (__return_storage_ptr__->lhs_)._M_ptr = prVar1;
  (__return_storage_ptr__->op_)._M_ptr = poVar2;
  (__return_storage_ptr__->rhs_)._M_ptr = prVar3;
  return __return_storage_ptr__;
}

Assistant:

static type instance(LHS const & lhs, RHS const & rhs) { return type(traits::clone<iface_type>(lhs), new op_binary<op_mult<numeric_type>, iface_type>(), traits::clone<iface_type>(rhs)); }